

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::FunctionCase::setGeneralUniforms
          (FunctionCase *this,deUint32 program)

{
  DataType dataType;
  glUniform1fFunc p_Var1;
  glGetUniformLocationFunc p_Var2;
  int i;
  int iVar3;
  GLint GVar4;
  int iVar5;
  undefined4 extraout_var;
  long *plVar6;
  long lVar7;
  glUniform4fvFunc *pp_Var8;
  int i_3;
  long *plVar9;
  int *data;
  glUniformMatrix4fvFunc *pp_Var10;
  uint uVar11;
  long lVar12;
  float values [4];
  long *local_f8;
  ulong local_f0;
  long local_e8;
  long lStack_e0;
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  glUniformMatrix4fvFunc *local_70;
  glUniformMatrix4fvFunc *local_68;
  glUniformMatrix4fvFunc *local_60;
  glUniform4fvFunc *local_58;
  glUniform4fvFunc *local_50;
  glUniform4fvFunc *local_48;
  glUniform4fvFunc *local_40;
  FunctionCase *local_38;
  Functions *gl;
  
  local_38 = this;
  iVar3 = (*((this->super_OperatorPerformanceCase).m_renderCtx)->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  p_Var1 = gl->uniform1f;
  GVar4 = (*gl->getUniformLocation)(program,"u_zero");
  (*p_Var1)(GVar4,0.0);
  local_70 = &gl->uniformMatrix4fv;
  local_68 = &gl->uniformMatrix3fv;
  local_60 = &gl->uniformMatrix2fv;
  local_48 = &gl->uniform4fv;
  local_50 = &gl->uniform3fv;
  local_58 = &gl->uniform2fv;
  local_40 = &gl->uniform1fv;
  iVar3 = 0;
  lVar12 = 0;
  do {
    dataType = local_38->m_paramTypes[lVar12];
    if (dataType != TYPE_INVALID) {
      iVar5 = glu::getDataTypeScalarSize(dataType);
      p_Var2 = gl->getUniformLocation;
      local_d8 = &local_c8;
      local_d0 = 0;
      local_c8 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_f8 = &local_e8;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_e8 = *plVar9;
        lStack_e0 = plVar6[3];
      }
      else {
        local_e8 = *plVar9;
        local_f8 = (long *)*plVar6;
      }
      local_f0 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      data = (int *)(ulong)(uint)(int)(char)((char)lVar12 + 'A');
      plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_f8,local_f0,0,'\x01');
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_a8 = *plVar9;
        lStack_a0 = plVar6[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar9;
        local_b8 = (long *)*plVar6;
      }
      local_b0 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      GVar4 = (*p_Var2)(program,(GLchar *)local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
      }
      uVar11 = (uint)lVar12;
      if (dataType < TYPE_FLOAT_MAT2) {
        lVar7 = 0;
        do {
          *(float *)((long)&local_b8 + lVar7 * 4) =
               (float)(int)uVar11 * 0.01 + (float)(int)lVar7 * 0.001;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        pp_Var8 = local_40;
        switch(iVar5) {
        case 1:
          break;
        case 2:
          pp_Var8 = local_58;
          break;
        case 3:
          pp_Var8 = local_50;
          break;
        case 4:
          pp_Var8 = local_48;
          break;
        default:
          goto switchD_013a1669_default;
        }
        (**pp_Var8)(GVar4,1,(GLfloat *)&local_b8);
      }
      else {
        if (dataType - TYPE_INT < 4) {
          lVar7 = 0;
          do {
            *(int *)((long)&local_b8 + lVar7 * 4) = iVar3 + (int)lVar7;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
        }
        else {
          if (3 < dataType - TYPE_BOOL) {
            if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
              iVar5 = glu::getDataTypeMatrixNumRows(dataType);
              lVar7 = 0;
              do {
                *(float *)((long)&local_b8 + lVar7 * 4) =
                     (float)(int)uVar11 * 0.01 + (float)(int)lVar7 * 0.001;
                lVar7 = lVar7 + 1;
              } while (lVar7 != 0x10);
              pp_Var10 = local_60;
              if (((iVar5 == 2) || (pp_Var10 = local_70, iVar5 == 4)) ||
                 (pp_Var10 = local_68, iVar5 == 3)) {
                (**pp_Var10)(GVar4,1,'\0',(GLfloat *)&local_b8);
              }
            }
            goto switchD_013a1669_default;
          }
          lVar7 = 0;
          do {
            *(uint *)((long)&local_b8 + lVar7 * 4) =
                 (uint)((uVar11 >> ((uint)lVar7 & 0x1f) & 1) != 0);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
        }
        uniformNiv(gl,iVar5,GVar4,(int)&local_b8,data);
      }
    }
switchD_013a1669_default:
    lVar12 = lVar12 + 1;
    iVar3 = iVar3 + 100;
    if (lVar12 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void FunctionCase::setGeneralUniforms (deUint32 program) const
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	gl.uniform1f(gl.getUniformLocation(program, "u_zero"), 0.0f);

	for (int paramNdx = 0; paramNdx < MAX_PARAMS; paramNdx++)
	{
		if (m_paramTypes[paramNdx] != glu::TYPE_INVALID)
		{
			const glu::DataType		paramType	= m_paramTypes[paramNdx];
			const int				scalarSize	= glu::getDataTypeScalarSize(paramType);
			const int				location	= gl.getUniformLocation(program, (string() + "u_inc" + (char)('A'+paramNdx)).c_str());

			if (glu::isDataTypeFloatOrVec(paramType))
			{
				float values[4];
				for (int i = 0; i < DE_LENGTH_OF_ARRAY(values); i++)
					values[i] = (float)paramNdx*0.01f + (float)i*0.001f; // Arbitrary small values.
				uniformNfv(gl, scalarSize, location, 1, &values[0]);
			}
			else if (glu::isDataTypeIntOrIVec(paramType))
			{
				int values[4];
				for (int i = 0; i < DE_LENGTH_OF_ARRAY(values); i++)
					values[i] = paramNdx*100 + i; // Arbitrary values.
				uniformNiv(gl, scalarSize, location, 1, &values[0]);
			}
			else if (glu::isDataTypeBoolOrBVec(paramType))
			{
				int values[4];
				for (int i = 0; i < DE_LENGTH_OF_ARRAY(values); i++)
					values[i] = (paramNdx >> i) & 1; // Arbitrary values.
				uniformNiv(gl, scalarSize, location, 1, &values[0]);
			}
			else if (glu::isDataTypeMatrix(paramType))
			{
				const int size = glu::getDataTypeMatrixNumRows(paramType);
				DE_ASSERT(size == glu::getDataTypeMatrixNumColumns(paramType));
				float values[4*4];
				for (int i = 0; i < DE_LENGTH_OF_ARRAY(values); i++)
					values[i] = (float)paramNdx*0.01f + (float)i*0.001f; // Arbitrary values.
				uniformMatrixNfv(gl, size, location, 1, &values[0]);
			}
			else
				DE_ASSERT(false);
		}
	}
}